

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

int __thiscall
QtPrivate::QGenericArrayOps<QCss::Pseudo>::truncate
          (QGenericArrayOps<QCss::Pseudo> *this,char *__file,__off_t __length)

{
  Pseudo *pPVar1;
  int extraout_EAX;
  
  pPVar1 = (this->super_QArrayDataPointer<QCss::Pseudo>).ptr;
  std::_Destroy_aux<false>::__destroy<QCss::Pseudo*>
            (pPVar1 + (long)__file,pPVar1 + (this->super_QArrayDataPointer<QCss::Pseudo>).size);
  (this->super_QArrayDataPointer<QCss::Pseudo>).size = (qsizetype)__file;
  return extraout_EAX;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }